

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

RPCHelpMan * listbanned(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined8 uVar5;
  RPCHelpMan *in_RDI;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff798;
  undefined8 in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7b8;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff7c8;
  pointer in_stack_fffffffffffff7d8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff7e0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff7e8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff7f0;
  pointer pRVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff810;
  pointer pRVar14;
  pointer pRVar15;
  vector<RPCResult,_std::allocator<RPCResult>_> local_7c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_7a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_790;
  vector<RPCResult,_std::allocator<RPCResult>_> local_778;
  RPCResults local_760;
  vector<RPCArg,_std::allocator<RPCArg>_> local_748;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  ulong *local_670;
  undefined8 local_668;
  ulong local_660;
  undefined8 uStack_658;
  ulong *local_650;
  size_type local_648;
  ulong local_640;
  undefined8 uStack_638;
  long *local_630 [2];
  long local_620 [2];
  long *local_610 [2];
  long local_600 [2];
  long *local_5f0 [2];
  long local_5e0 [2];
  long *local_5d0 [2];
  long local_5c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  size_type *local_590;
  size_type local_588;
  size_type local_580;
  undefined8 uStack_578;
  long *local_570 [2];
  long local_560 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  size_type *local_530;
  size_type local_528;
  size_type local_520 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_510;
  long *local_4f0 [2];
  long local_4e0 [2];
  pointer local_4d0 [2];
  undefined1 local_4c0 [152];
  RPCResult local_428;
  RPCResult local_3a0;
  RPCResult local_318;
  RPCResult local_290;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listbanned","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nList all manually banned IPs/Subnets.\n","");
  local_120[0] = local_110;
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_748.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  local_4d0[0] = (pointer)local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"address","");
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"The IP/Subnet of the banned node","");
  local_7a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description._M_string_length = in_stack_fffffffffffff7c0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description.field_2 = in_stack_fffffffffffff7c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff7e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff7d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff7e8;
  RPCResult::RPCResult
            ((RPCResult *)(local_4c0 + 0x10),STR,m_key_name,description,inner,SUB81(local_4d0,0));
  local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"ban_created","");
  std::operator+(&local_550,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_550," the ban was created");
  local_530 = local_520;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_520[0] = paVar4->_M_allocated_capacity;
    local_520[1] = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_520[0] = paVar4->_M_allocated_capacity;
    local_530 = psVar1;
  }
  local_528 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_00._M_string_length = in_stack_fffffffffffff7c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_00.field_2 = in_stack_fffffffffffff7c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7e8;
  RPCResult::RPCResult
            (&local_428,NUM_TIME,m_key_name_00,description_00,inner_00,SUB81(&local_510,0));
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"banned_until","");
  std::operator+(&local_5b0,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_5b0," the ban expires");
  local_590 = &local_580;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_580 = paVar4->_M_allocated_capacity;
    uStack_578 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_580 = paVar4->_M_allocated_capacity;
    local_590 = psVar1;
  }
  local_588 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_01._M_string_length = in_stack_fffffffffffff7c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_01.field_2 = in_stack_fffffffffffff7c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7e0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7e8;
  RPCResult::RPCResult(&local_3a0,NUM_TIME,m_key_name_01,description_01,inner_01,SUB81(local_570,0))
  ;
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"ban_duration","");
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5f0,"The ban duration, in seconds","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_02._M_string_length = in_stack_fffffffffffff7c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_02.field_2 = in_stack_fffffffffffff7c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff7e0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff7d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff7e8;
  RPCResult::RPCResult(&local_318,NUM_TIME,m_key_name_02,description_02,inner_02,SUB81(local_5d0,0))
  ;
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"time_remaining","");
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_630,"The time remaining until the ban expires, in seconds","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_03._M_string_length = in_stack_fffffffffffff7c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff7c8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_290,NUM_TIME,m_key_name_03,description_03,inner_03,SUB81(local_610,0))
  ;
  __l._M_len = 5;
  __l._M_array = (iterator)(local_4c0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_790,__l,(allocator_type *)&stack0xfffffffffffff7d7);
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_04._M_string_length = in_stack_fffffffffffff7c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff7c8._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_1c8,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_1e8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_778,__l_00,(allocator_type *)&stack0xfffffffffffff7d6);
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff798;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff7a8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff7b0;
  description_05._M_string_length = in_stack_fffffffffffff7c0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7b8;
  description_05.field_2 = in_stack_fffffffffffff7c8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_100,ARR,m_key_name_05,description_05,inner_05,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff798;
  result.m_key_name._M_string_length = in_stack_fffffffffffff7a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff7b0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff7b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff7c8;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff7f0;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff810;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_760,result);
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"listbanned","");
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"");
  HelpExampleCli(&local_690,&local_6b0,&local_6d0);
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"listbanned","");
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"");
  HelpExampleRpc(&local_6f0,&local_710,&local_730);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    uVar5 = local_690.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_6f0._M_string_length + local_690._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
      uVar5 = local_6f0.field_2._M_allocated_capacity;
    }
    if (local_6f0._M_string_length + local_690._M_string_length <= (ulong)uVar5) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_6f0,0,0,local_690._M_dataplus._M_p,local_690._M_string_length);
      goto LAB_00346701;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_690,local_6f0._M_dataplus._M_p,local_6f0._M_string_length);
LAB_00346701:
  local_670 = &local_660;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar4) {
    local_660 = paVar4->_M_allocated_capacity;
    uStack_658 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_660 = paVar4->_M_allocated_capacity;
    local_670 = puVar2;
  }
  local_648 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if (local_670 == &local_660) {
    uStack_638 = uStack_658;
    local_650 = &local_640;
  }
  else {
    local_650 = local_670;
  }
  local_640 = local_660;
  local_668 = 0;
  local_660 = local_660 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:830:9)>
           ::_M_manager;
  description_06._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:830:9)>
       ::_M_invoke;
  description_06._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/net.cpp:830:9)>
                ::_M_manager;
  description_06.field_2 = in_stack_fffffffffffff7c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7f0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = in_stack_fffffffffffff810;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_670 = &local_660;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff7a8)),description_06,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff7a8,&stack0xfffffffffffff7a8,3);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650,local_640 + 1);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670,local_660 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_760.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_778);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_790);
  lVar6 = 0x2a8;
  do {
    if ((long *)(local_4c0 + lVar6) != *(long **)((long)local_4d0 + lVar6)) {
      operator_delete(*(long **)((long)local_4d0 + lVar6),*(long *)(local_4c0 + lVar6) + 1);
    }
    if ((long *)((long)local_4e0 + lVar6) != *(long **)((long)local_4f0 + lVar6)) {
      operator_delete(*(long **)((long)local_4f0 + lVar6),*(long *)((long)local_4e0 + lVar6) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar6));
    if ((long *)((long)local_520 + lVar6) != *(long **)((long)&local_530 + lVar6)) {
      operator_delete(*(long **)((long)&local_530 + lVar6),*(long *)((long)local_520 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8);
  if (local_630[0] != local_620) {
    operator_delete(local_630[0],local_620[0] + 1);
  }
  if (local_610[0] != local_600) {
    operator_delete(local_610[0],local_600[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7f8);
  if (local_5f0[0] != local_5e0) {
    operator_delete(local_5f0[0],local_5e0[0] + 1);
  }
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0],local_5c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff818);
  if (local_590 != &local_580) {
    operator_delete(local_590,local_580 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if (local_570[0] != local_560) {
    operator_delete(local_570[0],local_560[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7c8);
  if (local_530 != local_520) {
    operator_delete(local_530,local_520[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if (local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_510.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_510.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7a8);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  if (local_4d0[0] != (pointer)local_4c0) {
    operator_delete(local_4d0[0],local_4c0._0_8_ + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_748);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listbanned()
{
    return RPCHelpMan{"listbanned",
                "\nList all manually banned IPs/Subnets.\n",
                {},
        RPCResult{RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The IP/Subnet of the banned node"},
                        {RPCResult::Type::NUM_TIME, "ban_created", "The " + UNIX_EPOCH_TIME + " the ban was created"},
                        {RPCResult::Type::NUM_TIME, "banned_until", "The " + UNIX_EPOCH_TIME + " the ban expires"},
                        {RPCResult::Type::NUM_TIME, "ban_duration", "The ban duration, in seconds"},
                        {RPCResult::Type::NUM_TIME, "time_remaining", "The time remaining until the ban expires, in seconds"},
                    }},
            }},
                RPCExamples{
                    HelpExampleCli("listbanned", "")
                            + HelpExampleRpc("listbanned", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    BanMan& banman = EnsureAnyBanman(request.context);

    banmap_t banMap;
    banman.GetBanned(banMap);
    const int64_t current_time{GetTime()};

    UniValue bannedAddresses(UniValue::VARR);
    for (const auto& entry : banMap)
    {
        const CBanEntry& banEntry = entry.second;
        UniValue rec(UniValue::VOBJ);
        rec.pushKV("address", entry.first.ToString());
        rec.pushKV("ban_created", banEntry.nCreateTime);
        rec.pushKV("banned_until", banEntry.nBanUntil);
        rec.pushKV("ban_duration", (banEntry.nBanUntil - banEntry.nCreateTime));
        rec.pushKV("time_remaining", (banEntry.nBanUntil - current_time));

        bannedAddresses.push_back(std::move(rec));
    }

    return bannedAddresses;
},
    };
}